

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

DAM * __thiscall Doublet::amlist(DAM *__return_storage_ptr__,Doublet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  iVar2 = (this->left).ijk._M_elems[1];
  iVar3 = (this->right).ijk._M_elems[1];
  iVar4 = (this->left).ijk._M_elems[0];
  iVar5 = (this->left).ijk._M_elems[2];
  iVar6 = (this->right).ijk._M_elems[0];
  iVar7 = (this->right).ijk._M_elems[2];
  std::__cxx11::string::string((string *)&local_40,(string *)&this->tag);
  (__return_storage_ptr__->dam)._M_elems[0] = iVar2 + iVar4 + iVar5;
  (__return_storage_ptr__->dam)._M_elems[1] = iVar3 + iVar6 + iVar7;
  paVar1 = &(__return_storage_ptr__->tag).field_2;
  (__return_storage_ptr__->tag)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(__return_storage_ptr__->tag).field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->tag)._M_dataplus._M_p = local_40;
    (__return_storage_ptr__->tag).field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (__return_storage_ptr__->tag)._M_string_length = local_38;
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

int am(void) const { return ijk[0] + ijk[1] + ijk[2]; }